

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformAction<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset_const&)>
          (Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
           *action,ArgumentTuple *args)

{
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Head_base<0UL,_const_ot::commissioner::ActiveOperationalDataset_&,_false> local_78;
  Result local_70;
  char local_30 [8];
  undefined8 uStack_28;
  
  pAVar1 = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  local_78._M_head_impl =
       (args->super__Tuple_impl<0UL,_const_ot::commissioner::ActiveOperationalDataset_&>).
       super__Head_base<0UL,_const_ot::commissioner::ActiveOperationalDataset_&,_false>._M_head_impl
  ;
  Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>::Perform
            (&local_70,action,(ArgumentTuple *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.mMessage._M_dataplus._M_p == &local_70.mMessage.field_2) {
    uStack_28 = local_70.mMessage.field_2._8_8_;
    local_70.mMessage._M_dataplus._M_p = local_30;
  }
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_00395c88;
  (pAVar1->result_).value_.mCode = local_70.mCode;
  paVar2 = &(pAVar1->result_).value_.mMessage.field_2;
  (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)paVar2;
  if (local_70.mMessage._M_dataplus._M_p == local_30) {
    paVar2->_M_allocated_capacity = local_70.mMessage.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(pAVar1->result_).value_.mMessage.field_2 + 8) = uStack_28;
  }
  else {
    (pAVar1->result_).value_.mMessage._M_dataplus._M_p = local_70.mMessage._M_dataplus._M_p;
    (pAVar1->result_).value_.mMessage.field_2._M_allocated_capacity =
         local_70.mMessage.field_2._M_allocated_capacity;
  }
  (pAVar1->result_).value_.mMessage._M_string_length = local_70.mMessage._M_string_length;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }